

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_state_begin(element_t *element,render_state_t *state,render_state_t *parent)

{
  float fVar1;
  _Bool _Var2;
  render_state_t *parent_local;
  render_state_t *state_local;
  element_t *element_local;
  
  state->parent = parent;
  state->element = element;
  state->mode = parent->mode;
  state->opacity = parent->opacity;
  fVar1 = (parent->matrix).b;
  (state->matrix).a = (parent->matrix).a;
  (state->matrix).b = fVar1;
  fVar1 = (parent->matrix).d;
  (state->matrix).c = (parent->matrix).c;
  (state->matrix).d = fVar1;
  fVar1 = (parent->matrix).f;
  (state->matrix).e = (parent->matrix).e;
  (state->matrix).f = fVar1;
  (state->extents).x = 0.0;
  (state->extents).y = 0.0;
  (state->extents).w = -1.0;
  (state->extents).h = -1.0;
  state->view_width = parent->view_width;
  state->view_height = parent->view_height;
  if ((element->parent != (element *)0x0) &&
     (_Var2 = parse_transform(element,0x26,&state->matrix), _Var2)) {
    plutovg_matrix_multiply(&state->matrix,&state->matrix,&parent->matrix);
  }
  if ((state->mode == render_mode_painting) &&
     (_Var2 = parse_number(element,0x14,&state->opacity,true,false), _Var2)) {
    state->opacity = parent->opacity * state->opacity;
  }
  return;
}

Assistant:

static void render_state_begin(const element_t* element, render_state_t* state, render_state_t* parent)
{
    state->parent = parent;
    state->element = element;
    state->mode = parent->mode;
    state->opacity = parent->opacity;
    state->matrix = parent->matrix;
    state->extents = INVALID_RECT;

    state->view_width = parent->view_width;
    state->view_height = parent->view_height;

    if(element->parent && parse_transform(element, ATTR_TRANSFORM, &state->matrix))
        plutovg_matrix_multiply(&state->matrix, &state->matrix, &parent->matrix);
    if(state->mode == render_mode_painting) {
        if(parse_number(element, ATTR_OPACITY, &state->opacity, true, false)) {
            state->opacity *= parent->opacity;
        }
    }
}